

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

bool __thiscall
wabt::WastParser::ParseTextListOpt
          (WastParser *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data)

{
  char *pcVar1;
  char cVar2;
  TokenType TVar3;
  Result RVar4;
  pointer pbVar5;
  char *pcVar6;
  uint32_t *puVar7;
  char *pcVar8;
  uint uVar9;
  bool bVar10;
  uint32_t lo;
  byte local_a9;
  uint32_t hi;
  basic_string_view<char,_std::char_traits<char>_> *local_98;
  basic_string_view<char,_std::char_traits<char>_> *local_90;
  TextVector texts;
  Token local_70;
  
  texts.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  texts.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  texts.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while (TVar3 = Peek(this,0), TVar3 == Text) {
    Consume(&local_70,this);
    _hi = Token::text(&local_70);
    std::
    vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
              ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)&texts,(basic_string_view<char,_std::char_traits<char>_> *)&hi);
  }
  local_98 = texts.
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  pbVar5 = texts.
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar5 == local_98) {
      bVar10 = texts.
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               texts.
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      std::
      _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~_Vector_base(&texts.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     );
      return bVar10;
    }
    local_70.loc.filename = *pbVar5;
    local_90 = pbVar5;
    if (2 < pbVar5->_M_len) {
      local_70.loc.filename =
           std::basic_string_view<char,_std::char_traits<char>_>::substr
                     ((basic_string_view<char,_std::char_traits<char>_> *)&local_70,1,
                      pbVar5->_M_len - 2);
      pcVar8 = local_70.loc.filename._M_str;
      pcVar6 = pcVar8 + local_70.loc.filename._M_len;
      for (; pcVar8 < pcVar6; pcVar8 = pcVar8 + 1) {
        if (*pcVar8 == '\\') {
          pcVar1 = pcVar8 + 1;
          cVar2 = pcVar8[1];
          puVar7 = &hi;
          switch(cVar2) {
          case 'n':
            hi._0_1_ = 10;
            pcVar8 = pcVar1;
            break;
          case 'o':
          case 'p':
          case 'q':
          case 's':
switchD_0017b4c6_caseD_6f:
            RVar4 = ParseHexdigit(cVar2,&hi);
            if ((RVar4.enum_ != Ok) || (RVar4 = ParseHexdigit(pcVar8[2],&lo), RVar4.enum_ != Ok)) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                            ,0x83,
                            "void wabt::(anonymous namespace)::RemoveEscapes(std::string_view, OutputIter) [OutputIter = std::back_insert_iterator<std::vector<unsigned char>>]"
                           );
            }
            pcVar8 = pcVar8 + 2;
            local_a9 = (byte)(hi << 4) | (byte)lo;
            puVar7 = (uint32_t *)&local_a9;
            goto LAB_0017b4dc;
          case 'r':
            hi._0_1_ = 0xd;
            pcVar8 = pcVar1;
            break;
          case 't':
            hi._0_1_ = 9;
            pcVar8 = pcVar1;
            break;
          case 'u':
            cVar2 = pcVar8[3];
            pcVar8 = pcVar8 + 3;
            uVar9 = 0;
            do {
              RVar4 = ParseHexdigit(cVar2,&hi);
              if (RVar4.enum_ != Ok) {
                pcVar8 = "0";
                uVar9 = 0x5b;
                goto LAB_0017b6be;
              }
              uVar9 = uVar9 << 4 | hi;
              cVar2 = pcVar8[1];
              pcVar8 = pcVar8 + 1;
            } while (cVar2 != '}');
            if (0x10ffff < uVar9) {
              pcVar8 = "scalar_value < 0x110000";
              uVar9 = 0x61;
LAB_0017b6be:
              __assert_fail(pcVar8,
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                            ,uVar9,
                            "void wabt::(anonymous namespace)::RemoveEscapes(std::string_view, OutputIter) [OutputIter = std::back_insert_iterator<std::vector<unsigned char>>]"
                           );
            }
            if (uVar9 < 0x80) {
              lo = CONCAT31(lo._1_3_,(char)uVar9);
              puVar7 = &lo;
              break;
            }
            if (uVar9 < 0x800) {
              lo = CONCAT31(lo._1_3_,(char)(uVar9 >> 6)) | 0xc0;
            }
            else {
              if (uVar9 < 0x10000) {
                lo = CONCAT31(lo._1_3_,(char)(uVar9 >> 0xc)) | 0xe0;
              }
              else {
                lo = CONCAT31(lo._1_3_,(char)(uVar9 >> 0x12)) | 0xf0;
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                emplace_back<unsigned_char>(out_data,(uchar *)&lo);
                lo = CONCAT31(lo._1_3_,(char)(uVar9 >> 0xc)) & 0xffffff3f | 0x80;
              }
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
              emplace_back<unsigned_char>(out_data,(uchar *)&lo);
              lo = CONCAT31(lo._1_3_,(char)(uVar9 >> 6)) & 0xffffff3f | 0x80;
            }
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                      (out_data,(uchar *)&lo);
            lo = CONCAT31(lo._1_3_,(char)uVar9) & 0xffffff3f | 0x80;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                      (out_data,(uchar *)&lo);
            goto LAB_0017b5ce;
          default:
            if (cVar2 == '\"') {
              hi._0_1_ = 0x22;
              pcVar8 = pcVar1;
            }
            else if (cVar2 == '\'') {
              hi._0_1_ = 0x27;
              pcVar8 = pcVar1;
            }
            else {
              if (cVar2 != '\\') goto switchD_0017b4c6_caseD_6f;
              hi._0_1_ = 0x5c;
              pcVar8 = pcVar1;
            }
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (out_data,(uchar *)puVar7);
        }
        else {
          hi._0_1_ = *pcVar8;
          puVar7 = &hi;
LAB_0017b4dc:
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (out_data,(uchar *)puVar7);
        }
LAB_0017b5ce:
      }
    }
    pbVar5 = local_90 + 1;
  } while( true );
}

Assistant:

bool WastParser::ParseTextListOpt(std::vector<uint8_t>* out_data) {
  WABT_TRACE(ParseTextListOpt);
  TextVector texts;
  while (PeekMatch(TokenType::Text))
    texts.push_back(Consume().text());

  RemoveEscapes(texts, std::back_inserter(*out_data));
  return !texts.empty();
}